

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_grana_2016.h
# Opt level: O3

void __thiscall PRED<UFPC>::FirstScan(PRED<UFPC> *this)

{
  long lVar1;
  char *pcVar2;
  char cVar3;
  uint uVar4;
  Mat1i *pMVar5;
  Mat1b *pMVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  int iVar10;
  uint uVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  int iVar15;
  ulong uVar16;
  long lVar17;
  long lVar18;
  ulong uVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  char *pcVar23;
  long lVar24;
  uint *puVar25;
  uint *puVar26;
  int iVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  
  pMVar5 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
  uVar19 = 0;
  memset(*(void **)&pMVar5->field_0x10,0,*(long *)&pMVar5->field_0x20 - *(long *)&pMVar5->field_0x18
        );
  puVar25 = UFPC::P_;
  *UFPC::P_ = 0;
  UFPC::length_ = 1;
  pMVar6 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  iVar27 = *(int *)&pMVar6->field_0xc;
  lVar28 = (long)iVar27;
  uVar4 = *(uint *)&pMVar6->field_0x8;
  if (0 < lVar28) {
    lVar29 = *(long *)&pMVar6->field_0x10;
    lVar31 = *(long *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0x10;
    do {
      iVar15 = (int)uVar19;
      if (*(char *)(lVar29 + iVar15) != '\0') {
        puVar25[UFPC::length_] = UFPC::length_;
        uVar11 = UFPC::length_ + 1;
        *(uint *)(lVar31 + (long)iVar15 * 4) = UFPC::length_;
        UFPC::length_ = uVar11;
        if (iVar27 <= iVar15 + 1) break;
        uVar19 = (ulong)(iVar15 + 1);
        while (*(char *)(lVar29 + uVar19) != '\0') {
          *(undefined4 *)(lVar31 + uVar19 * 4) =
               *(undefined4 *)(lVar31 + (long)((int)uVar19 + -1) * 4);
          uVar19 = uVar19 + 1;
          if (iVar27 == (int)uVar19) goto LAB_001a4cd4;
        }
      }
      uVar11 = (int)uVar19 + 1;
      uVar19 = (ulong)uVar11;
    } while ((int)uVar11 < iVar27);
  }
LAB_001a4cd4:
  if (1 < (int)uVar4) {
    uVar19 = 1;
    lVar29 = lVar28 + -1;
    lVar31 = 0;
    do {
      pMVar6 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
      pMVar5 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
      lVar17 = *(long *)&pMVar6->field_0x10;
      lVar7 = **(long **)&pMVar6->field_0x48;
      lVar30 = lVar7 * uVar19;
      lVar20 = lVar17 + lVar30;
      pcVar23 = (char *)(lVar20 - lVar7);
      lVar8 = *(long *)&pMVar5->field_0x10;
      lVar9 = **(long **)&pMVar5->field_0x48;
      lVar12 = lVar9 * uVar19;
      puVar25 = (uint *)(lVar8 + lVar12);
      puVar26 = (uint *)((long)puVar25 - lVar9);
      iVar27 = (int)lVar29;
      if (iVar27 == 0) {
        if (*(char *)(lVar17 + lVar30) != '\0') {
          if (*pcVar23 == '\0') {
            UFPC::P_[UFPC::length_] = UFPC::length_;
            uVar11 = UFPC::length_ + 1;
            *puVar25 = UFPC::length_;
            UFPC::length_ = uVar11;
          }
          else {
            *puVar25 = *puVar26;
          }
        }
      }
      else {
        lVar13 = lVar29;
        if (*(char *)(lVar17 + lVar30) == '\0') {
          uVar16 = 0;
          goto LAB_001a4e06;
        }
        if (*pcVar23 == '\0') {
          if (pcVar23[1] == '\0') {
            UFPC::P_[UFPC::length_] = UFPC::length_;
            uVar11 = UFPC::length_ + 1;
            *puVar25 = UFPC::length_;
            UFPC::length_ = uVar11;
            iVar15 = 0;
            goto LAB_001a4fea;
          }
          *puVar25 = puVar26[1];
          uVar16 = 0;
          goto LAB_001a5143;
        }
        *puVar25 = *puVar26;
        uVar16 = 0;
LAB_001a5178:
        iVar15 = (int)uVar16;
        if (iVar15 + 1 < iVar27) {
          lVar24 = (long)iVar15;
          lVar14 = lVar12 + lVar24 * 4;
          lVar22 = 0;
          while( true ) {
            if (*(char *)(lVar24 + lVar30 + lVar17 + 1 + lVar22) == '\0') {
              uVar11 = (int)(lVar24 + 1) + (int)lVar22;
              goto LAB_001a52a8;
            }
            if (*(char *)(lVar7 * lVar31 + lVar24 + lVar17 + 1 + lVar22) == '\0') break;
            *(undefined4 *)(lVar8 + 4 + lVar14 + lVar22 * 4) =
                 *(undefined4 *)(lVar9 * lVar31 + lVar24 * 4 + lVar8 + 4 + lVar22 * 4);
            lVar22 = lVar22 + 1;
            if (lVar24 + (1 - lVar28) + 1 + lVar22 == 0) {
              iVar15 = iVar15 + (int)lVar22;
              goto LAB_001a5242;
            }
          }
          uVar16 = lVar24 + 1 + lVar22;
          iVar15 = iVar15 + (int)lVar22;
          iVar10 = iVar15 + 2;
          if (pcVar23[iVar10] == '\0') {
            *(uint *)(lVar14 + lVar8 + 4 + lVar22 * 4) = puVar25[iVar15];
            iVar15 = (int)uVar16;
            goto LAB_001a4fea;
          }
          uVar11 = UFPC::Merge(puVar25[iVar15],puVar26[iVar10]);
          *(uint *)(lVar14 + lVar8 + 4 + lVar22 * 4) = uVar11;
LAB_001a5143:
          do {
            lVar14 = (long)(int)uVar16;
            uVar16 = lVar14 + 1;
            cVar3 = *(char *)(lVar20 + 1 + lVar14);
            if (iVar27 <= (int)uVar16) {
              if (cVar3 != '\0') {
                puVar25[lVar14 + 1] = puVar26[lVar14 + 1];
              }
              goto LAB_001a5274;
            }
            if (cVar3 != '\0') {
              puVar25[lVar14 + 1] = puVar26[lVar14 + 1];
              goto LAB_001a5178;
            }
LAB_001a4e06:
            while( true ) {
              lVar24 = (long)(int)uVar16;
              lVar14 = lVar24 << 0x20;
              lVar22 = 0;
              do {
                lVar18 = lVar14;
                lVar21 = lVar18 >> 0x20;
                if (lVar29 <= lVar24 + lVar22 + 1) {
                  lVar17 = lVar18 + 0x100000000 >> 0x20;
                  if (*(char *)(lVar20 + lVar17) == '\0') goto LAB_001a5274;
                  if (pcVar23[lVar17] == '\0') {
                    if (pcVar23[lVar21] == '\0') {
                      UFPC::P_[UFPC::length_] = UFPC::length_;
                      uVar11 = UFPC::length_ + 1;
                      puVar25[lVar17] = UFPC::length_;
                      UFPC::length_ = uVar11;
                      goto LAB_001a5274;
                    }
                    uVar11 = puVar26[lVar21];
                  }
                  else {
                    uVar11 = puVar26[lVar17];
                  }
                  puVar25[lVar17] = uVar11;
                  goto LAB_001a5274;
                }
                lVar1 = lVar22 + 1;
                pcVar2 = (char *)(lVar24 + lVar30 + lVar17 + 1 + lVar22);
                lVar14 = lVar18 + 0x100000000;
                lVar22 = lVar1;
              } while (*pcVar2 == '\0');
              uVar16 = (uVar16 & 0xffffffff) + lVar1;
              if (*(char *)(lVar1 + lVar7 * lVar31 + lVar24 + lVar17) != '\0') {
                *(undefined4 *)(lVar12 + lVar24 * 4 + lVar8 + lVar1 * 4) =
                     *(undefined4 *)(lVar9 * lVar31 + lVar24 * 4 + lVar8 + lVar1 * 4);
                goto LAB_001a5178;
              }
              lVar14 = lVar18 + 0x200000000 >> 0x20;
              if (pcVar23[lVar14] != '\0') break;
              if (pcVar23[lVar21] == '\0') {
                UFPC::P_[UFPC::length_] = UFPC::length_;
                uVar11 = UFPC::length_ + 1;
                *(uint *)(lVar12 + lVar24 * 4 + lVar8 + lVar1 * 4) = UFPC::length_;
                UFPC::length_ = uVar11;
              }
              else {
                *(uint *)(lVar12 + lVar24 * 4 + lVar8 + lVar1 * 4) = puVar26[lVar21];
              }
              iVar15 = (int)uVar16;
LAB_001a4fea:
              if (iVar27 <= iVar15 + 1) {
                lVar13 = (long)(iVar15 + 1);
LAB_001a50b2:
                if (*(char *)(lVar20 + lVar13) == '\0') goto LAB_001a5274;
                goto LAB_001a5254;
              }
              lVar22 = (long)iVar15;
              lVar24 = lVar22 << 0x20;
              lVar14 = lVar12 + lVar22 * 4;
              lVar18 = lVar8 + lVar14;
              lVar21 = 0;
              while (*(char *)(lVar30 + lVar22 + lVar17 + 1 + lVar21) != '\0') {
                if (*(char *)(lVar7 * lVar31 + lVar22 + lVar17 + 2 + lVar21) != '\0') {
                  uVar16 = (ulong)(uint)(iVar15 + 1 + (int)lVar21);
                  uVar11 = UFPC::Merge(*(uint *)((long)puVar25 + (lVar24 >> 0x1e)),
                                       *(uint *)(lVar9 * lVar31 + lVar22 * 4 + lVar8 + 8 +
                                                lVar21 * 4));
                  *(uint *)(lVar14 + lVar8 + 4 + lVar21 * 4) = uVar11;
                  goto LAB_001a5143;
                }
                *(undefined4 *)(lVar18 + 4 + lVar21 * 4) = *(undefined4 *)(lVar18 + lVar21 * 4);
                lVar24 = lVar24 + 0x100000000;
                lVar21 = lVar21 + 1;
                if ((1 - lVar28) + lVar22 + 1 + lVar21 == 0) {
                  iVar15 = iVar15 + (int)lVar21;
                  goto LAB_001a50b2;
                }
              }
              uVar11 = iVar15 + 1 + (int)lVar21;
LAB_001a52a8:
              uVar16 = (ulong)uVar11;
            }
            if (pcVar23[lVar21] == '\0') {
              uVar11 = puVar26[lVar14];
            }
            else {
              uVar11 = UFPC::Merge(puVar26[lVar21],puVar26[lVar14]);
            }
            *(uint *)(lVar12 + lVar24 * 4 + lVar8 + lVar1 * 4) = uVar11;
          } while( true );
        }
        lVar13 = (long)(iVar15 + 1);
LAB_001a5242:
        if (*(char *)(lVar20 + lVar13) != '\0') {
          if (pcVar23[lVar13] == '\0') {
LAB_001a5254:
            uVar11 = puVar25[iVar15];
          }
          else {
            uVar11 = puVar26[lVar13];
          }
          puVar25[lVar13] = uVar11;
        }
      }
LAB_001a5274:
      uVar19 = uVar19 + 1;
      lVar31 = lVar31 + 1;
    } while (uVar19 != uVar4);
  }
  return;
}

Assistant:

void FirstScan()
    {
        memset(img_labels_.data, 0, img_labels_.dataend - img_labels_.datastart); // Initialization
        LabelsSolver::Setup();

        // First Scan
        int w(img_.cols);
        int h(img_.rows);

#define CONDITION_X img_row[c]>0
#define CONDITION_P img_row_prev[c-1]>0
#define CONDITION_Q img_row_prev[c]>0
#define CONDITION_R img_row_prev[c+1]>0

#define ACTION_1 // nothing to do 
#define ACTION_2 img_labels_row[c] = LabelsSolver::NewLabel(); // new label
#define ACTION_3 img_labels_row[c] = img_labels_row_prev[c - 1]; // x <- p
#define ACTION_4 img_labels_row[c] = img_labels_row_prev[c]; // x <- q
#define ACTION_5 img_labels_row[c] = img_labels_row_prev[c + 1]; // x <- r
#define ACTION_6 img_labels_row[c] = img_labels_row[c - 1]; // x <- s
#define ACTION_7 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev[c - 1], img_labels_row_prev[c + 1]); // x <- p + r
#define ACTION_8 img_labels_row[c] = LabelsSolver::Merge(img_labels_row[c - 1], img_labels_row_prev[c + 1]); // x <- s + r

#define COLS w

        {
            // Get rows pointer
            const unsigned char* const img_row = img_.ptr<unsigned char>(0);
            unsigned int* const img_labels_row = img_labels_.ptr<unsigned int>(0);

#include "labeling_grana_2016_forest_0.inc.h"
                
        }

        for (int r = 1; r < h; ++r) {
            // Get rows pointer
            const unsigned char* const img_row = img_.ptr<unsigned char>(r);
            const unsigned char* const img_row_prev = (unsigned char *)(((char *)img_row) - img_.step.p[0]);
            unsigned int* const img_labels_row = img_labels_.ptr<unsigned int>(r);
            unsigned int* const img_labels_row_prev = (unsigned int *)(((char *)img_labels_row) - img_labels_.step.p[0]);
        
#include "labeling_grana_2016_forest.inc.h"  

        }//End rows's for

#undef ACTION_1
#undef ACTION_2
#undef ACTION_3
#undef ACTION_4
#undef ACTION_5
#undef ACTION_6
#undef ACTION_7
#undef ACTION_8

#undef CONDITION_X
#undef CONDITION_P
#undef CONDITION_Q
#undef CONDITION_R
    }